

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3SnippetFindPositions(Fts3Expr *pExpr,int iPhrase,void *ctx)

{
  long lVar1;
  int iVar2;
  char **pp;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  long in_FS_OFFSET;
  int rc;
  SnippetPhrase *pPhrase;
  SnippetIter *p;
  i64 iFirst;
  char *pCsr;
  char **in_stack_00000048;
  int in_stack_00000054;
  Fts3Expr *in_stack_00000058;
  Fts3Cursor *in_stack_00000060;
  undefined4 in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pp = (char **)(*(long *)(in_RDX + 0x18) + (long)in_ESI * 0x30);
  *(undefined4 *)pp = *(undefined4 *)(*(long *)(in_RDI + 0x20) + 0x50);
  iVar2 = sqlite3Fts3EvalPhrasePoslist
                    (in_stack_00000060,in_stack_00000058,in_stack_00000054,in_stack_00000048);
  pp[1] = &DAT_aaaaaaaaaaaaaaaa;
  fts3GetDeltaPosition(pp,(i64 *)CONCAT44(iVar2,in_stack_ffffffffffffffb8));
  pp[3] = &DAT_aaaaaaaaaaaaaaaa;
  pp[5] = &DAT_aaaaaaaaaaaaaaaa;
  pp[2] = (char *)0x0;
  pp[4] = (char *)0x0;
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return iVar2;
}

Assistant:

static int fts3SnippetFindPositions(Fts3Expr *pExpr, int iPhrase, void *ctx){
  SnippetIter *p = (SnippetIter *)ctx;
  SnippetPhrase *pPhrase = &p->aPhrase[iPhrase];
  char *pCsr;
  int rc;

  pPhrase->nToken = pExpr->pPhrase->nToken;
  rc = sqlite3Fts3EvalPhrasePoslist(p->pCsr, pExpr, p->iCol, &pCsr);
  assert( rc==SQLITE_OK || pCsr==0 );
  if( pCsr ){
    i64 iFirst = 0;
    pPhrase->pList = pCsr;
    fts3GetDeltaPosition(&pCsr, &iFirst);
    if( iFirst<0 ){
      rc = FTS_CORRUPT_VTAB;
    }else{
      pPhrase->pHead = pCsr;
      pPhrase->pTail = pCsr;
      pPhrase->iHead = iFirst;
      pPhrase->iTail = iFirst;
    }
  }else{
    assert( rc!=SQLITE_OK || (
       pPhrase->pList==0 && pPhrase->pHead==0 && pPhrase->pTail==0
    ));
  }

  return rc;
}